

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pending-c.cpp
# Opt level: O2

duckdb_state
duckdb_pending_prepared_internal
          (duckdb_prepared_statement prepared_statement,duckdb_pending_result *out_result,
          bool allow_streaming)

{
  bool bVar1;
  duckdb_state dVar2;
  duckdb_pending_result this;
  pointer named_values;
  pointer this_00;
  __uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
  local_a0;
  
  if (out_result == (duckdb_pending_result *)0x0 ||
      prepared_statement == (duckdb_prepared_statement)0x0) {
    dVar2 = DuckDBError;
  }
  else {
    this = (duckdb_pending_result)operator_new(0x10);
    *(__uniq_ptr_data<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true,_true>
      *)this = (__uniq_ptr_data<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true,_true>
                )0x0;
    *(__uniq_ptr_data<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true,_true>
      *)(this + 8) =
         (__uniq_ptr_data<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true,_true>
          )0x0;
    this[8] = (_duckdb_pending_result)allow_streaming;
    named_values = duckdb::
                   unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                   ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                                 *)(prepared_statement + 0x38));
    duckdb::PreparedStatement::PendingQuery
              ((PreparedStatement *)&stack0xffffffffffffff60,
               (case_insensitive_map_t<BoundParameterData> *)named_values,
               SUB81(prepared_statement,0));
    *(tuple<duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_> *)this =
         local_a0._M_t.
         super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
         .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl;
    this_00 = duckdb::
              unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
              ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                            *)this);
    bVar1 = duckdb::BaseQueryResult::HasError(&this_00->super_BaseQueryResult);
    dVar2 = (duckdb_state)bVar1;
    *out_result = this;
  }
  return dVar2;
}

Assistant:

duckdb_state duckdb_pending_prepared_internal(duckdb_prepared_statement prepared_statement,
                                              duckdb_pending_result *out_result, bool allow_streaming) {
	if (!prepared_statement || !out_result) {
		return DuckDBError;
	}
	auto wrapper = reinterpret_cast<PreparedStatementWrapper *>(prepared_statement);
	auto result = new PendingStatementWrapper();
	result->allow_streaming = allow_streaming;

	try {
		result->statement = wrapper->statement->PendingQuery(wrapper->values, allow_streaming);
	} catch (std::exception &ex) {
		result->statement = make_uniq<PendingQueryResult>(duckdb::ErrorData(ex));
	}
	duckdb_state return_value = !result->statement->HasError() ? DuckDBSuccess : DuckDBError;
	*out_result = reinterpret_cast<duckdb_pending_result>(result);

	return return_value;
}